

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O0

int gost_ciphers(ENGINE *e,EVP_CIPHER **cipher,int **nids,int nid)

{
  EVP_CIPHER *pEVar1;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *n;
  int i;
  GOST_cipher *in_stack_000000a8;
  int *local_30;
  uint local_28;
  uint local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_30 = known_cipher_nids;
    *in_RDX = known_cipher_nids;
    for (local_28 = 0; local_28 < 0x14; local_28 = local_28 + 1) {
      *local_30 = gost_cipher_array[(int)local_28]->nid;
      local_30 = local_30 + 1;
    }
    local_4 = local_28;
  }
  else {
    for (local_28 = 0; local_28 < 0x14; local_28 = local_28 + 1) {
      if (in_ECX == gost_cipher_array[(int)local_28]->nid) {
        pEVar1 = GOST_init_cipher(in_stack_000000a8);
        *in_RSI = pEVar1;
        return 1;
      }
    }
    *in_RSI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gost_ciphers(ENGINE *e, const EVP_CIPHER **cipher,
                        const int **nids, int nid)
{
    int i;

    if (!cipher) {
        int *n = known_cipher_nids;

        *nids = n;
        for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
            *n++ = gost_cipher_array[i]->nid;
        return i;
    }

    for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
        if (nid == gost_cipher_array[i]->nid) {
            *cipher = GOST_init_cipher(gost_cipher_array[i]);
            return 1;
        }
    *cipher = NULL;
    return 0;
}